

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O0

BoolExpr * BO_or(List *ls)

{
  bool bVar1;
  ListStruct *pLVar2;
  BoolExpr *ret;
  BoolExpr *subexpr;
  List *pLStack_18;
  BOOL hit_false;
  List *ls_local;
  
  bVar1 = false;
  ls_local = (List *)create_bool_expr(E_OR,(BoolExpr *)0x0);
  pLStack_18 = ls;
  while( true ) {
    pLStack_18 = pLStack_18->cdr;
    if (pLStack_18 == (List *)0x0) {
      if (ls_local->car == (ListStruct *)0x0) {
        if (bVar1) {
          ls_local = (List *)&false_bool_expr;
        }
        else {
          parse_error((List *)0x0,"or takes arguments!\n");
          ls_local = (List *)&false_bool_expr;
        }
      }
      else if (*(BoolExprStruct **)&ls_local->car->token == (BoolExprStruct *)0x0) {
        ls_local = ls_local->car;
      }
      return (BoolExpr *)ls_local;
    }
    pLVar2 = (ListStruct *)make_boolean_expr(pLStack_18);
    if (*(BoolExprType *)&pLVar2->cdr == E_TRUE) break;
    if (*(BoolExprType *)&pLVar2->cdr == E_FALSE) {
      bVar1 = true;
    }
    else {
      *(ListStruct **)&pLVar2->token = ls_local->car;
      ls_local->car = pLVar2;
    }
  }
  ls_local = (List *)&true_bool_expr;
  return (BoolExpr *)ls_local;
}

Assistant:

static BoolExpr *
BO_or (const List *ls)
{
  BOOL hit_false = FALSE;
  BoolExpr *subexpr, *ret;

  ret = create_bool_expr (E_OR, NULL);
  while ((ls = ls->cdr))
    {
      subexpr = make_boolean_expr (ls);
      if (subexpr->type == E_TRUE)
	return &true_bool_expr;
      if (subexpr->type == E_FALSE)  /* No sense adding in FALSE statements*/
	hit_false = TRUE;
      else
	{
	  subexpr->next = ret->subexpr;
	  ret->subexpr = subexpr;
	}
    }
  if (ret->subexpr == NULL)
    {
      if (hit_false)   /* If we hit nothing but FALSE's return FALSE */
	return &false_bool_expr;
      parse_error(ls, "or takes arguments!\n");
      return &false_bool_expr;   /* Default = FALSE */
    }
  
  if (ret->subexpr->next == NULL) /* (or a) == a */
    return ret->subexpr;
  
  return ret;
}